

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string_view __thiscall
bloaty::RangeSink::ZlibDecompress(RangeSink *this,string_view data,uint64_t uncompressed_size)

{
  FILE *__stream;
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  unsigned_long uVar4;
  const_pointer pvVar5;
  ulong in_RCX;
  long in_RDI;
  uLongf zliblen;
  uchar *dbuf;
  uint64_t mb;
  string_view sv;
  size_t n;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  LogMessage *in_stack_fffffffffffffe70;
  char *pcVar6;
  type_info *in_stack_fffffffffffffe78;
  Arena *in_stack_fffffffffffffe80;
  undefined1 *in_stack_fffffffffffffe88;
  ArenaImpl *in_stack_fffffffffffffe90;
  size_type local_118;
  char *local_110;
  long local_108;
  ulong local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  string_view local_e0 [2];
  byte local_b9;
  ulong local_80;
  long local_78;
  char *local_70;
  size_t local_68;
  byte local_49;
  undefined1 local_48 [56];
  ulong local_10;
  long local_8;
  
  if (*(long *)(in_RDI + 0x110) == 0) {
    Throw((char *)in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  }
  local_108 = 0x100000;
  local_100 = in_RCX;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_f0);
  uVar1 = local_100;
  __stream = _stderr;
  if (sVar3 * 0x1e + local_108 * 0x80 < in_RCX) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_f0);
    fprintf(__stream,
            "warning: ignoring compressed debug data, implausible uncompressed size (compressed: %zu, uncompressed: %lu)\n"
            ,sVar3,local_100);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_e0);
  }
  else {
    local_78 = *(long *)(in_RDI + 0x110);
    local_80 = local_100;
    uVar4 = std::numeric_limits<unsigned_long>::max();
    local_b9 = 0;
    if (uVar4 < uVar1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffe80,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                 (char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_b9 = 1;
      google::protobuf::internal::LogMessage::operator<<
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      google::protobuf::internal::LogMessage::operator<<
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      google::protobuf::internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffe70,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    }
    if ((local_b9 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x1764a8);
    }
    uVar1 = local_80;
    if (local_78 == 0) {
      local_70 = (char *)operator_new__(local_80);
    }
    else {
      local_8 = local_78;
      local_10 = local_80;
      uVar4 = std::numeric_limits<unsigned_long>::max();
      local_49 = 0;
      if (uVar4 < uVar1) {
        in_stack_fffffffffffffe88 = local_48;
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)in_stack_fffffffffffffe80,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                   (char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        local_49 = 1;
        in_stack_fffffffffffffe90 =
             (ArenaImpl *)
             google::protobuf::internal::LogMessage::operator<<
                       (in_stack_fffffffffffffe70,
                        (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        in_stack_fffffffffffffe80 =
             (Arena *)google::protobuf::internal::LogMessage::operator<<
                                (in_stack_fffffffffffffe70,
                                 (char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68));
        google::protobuf::internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffe70,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
      if ((local_49 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)0x1765ec);
      }
      local_68 = google::protobuf::internal::AlignUpTo8(local_10);
      google::protobuf::Arena::AllocHook
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (size_t)in_stack_fffffffffffffe70);
      local_70 = (char *)google::protobuf::internal::ArenaImpl::AllocateAligned
                                   (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    }
    local_110 = local_70;
    local_118 = local_100;
    pcVar6 = local_70;
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_f0);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_f0);
    iVar2 = uncompress(pcVar6,&local_118,pvVar5,sVar3);
    if (iVar2 != 0) {
      Throw((char *)in_stack_fffffffffffffe80,(int)((ulong)pvVar5 >> 0x20));
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_e0,local_110,local_118);
  }
  return local_e0[0];
}

Assistant:

std::string_view RangeSink::ZlibDecompress(std::string_view data,
                                            uint64_t uncompressed_size) {
  if (!arena_) {
    THROW("This range sink isn't prepared to zlib decompress.");
  }
  uint64_t mb = 1 << 20;
  // Limit for uncompressed size is 30x the compressed size + 128MB.
  if (uncompressed_size >
      static_cast<uint64_t>(data.size()) * 30 + (128 * mb)) {
    fprintf(stderr,
            "warning: ignoring compressed debug data, implausible uncompressed "
            "size (compressed: %zu, uncompressed: %" PRIu64 ")\n",
            data.size(), uncompressed_size);
    return std::string_view();
  }
  unsigned char* dbuf =
      arena_->google::protobuf::Arena::CreateArray<unsigned char>(
          arena_, uncompressed_size);
  uLongf zliblen = uncompressed_size;
  if (uncompress(dbuf, &zliblen, (unsigned char*)(data.data()), data.size()) !=
      Z_OK) {
    THROW("Error decompressing debug info");
  }
  string_view sv(reinterpret_cast<char*>(dbuf), zliblen);
  return sv;
}